

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O1

ptr<req_msg> __thiscall
nuraft::raft_server::create_append_entries_req(raft_server *this,ptr<peer> *pp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  uint uVar15;
  ulong prev_end_idx;
  mutex_type *pmVar16;
  long lVar17;
  element_type *peVar18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  undefined8 uVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var22;
  ptr<req_msg> pVar23;
  unique_lock<std::recursive_mutex> guard;
  ptr<req_msg> *req;
  ptr<snapshot> snp_local;
  undefined1 local_d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  log_val_type local_82;
  undefined1 local_81;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  int local_6c;
  _Any_data local_68;
  undefined1 local_58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  
  peVar18 = (element_type *)*in_RDX;
  local_d8._0_8_ = pp + 0x3e;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  local_58._16_8_ = in_RDX;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_d8);
  local_d8[8] = 1;
  local_a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (*(code *)((((pp[0x2e].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->endpoint_).field_2._M_allocated_capacity)();
  peVar3 = pp[9].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = pp[10].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80._M_pi =
       ((pp[0x2d].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_d8);
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)(peVar18 + 0x1b));
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(peVar3->config_).
                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1);
  if (peVar18[0xd]._vptr_rpc_client_factory == (_func_int **)0x0) {
    LOCK();
    peVar18[0xd]._vptr_rpc_client_factory = (_func_int **)p_Var20;
    UNLOCK();
  }
  p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18[0xd]._vptr_rpc_client_factory;
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var12[-1]._M_weak_count + 3);
  local_98 = peVar18;
  pthread_mutex_unlock((pthread_mutex_t *)(peVar18 + 0x1b));
  peVar18 = local_98;
  p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_a8 = p_Var11;
  if (p_Var20 <= p_Var11) {
    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar9 = (*p_Var4->_vptr__Sp_counted_base[7])(), 1 < iVar9)) {
      p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,"Peer\'s lastLogIndex is too large %lu v.s. %lu, ",local_a8,
                 p_Var20);
      (*p_Var11->_vptr__Sp_counted_base[8])
                (p_Var11,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x18b,(string *)local_d8);
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    pp_Var5 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base;
    (**(code **)(*pp_Var5 + 0x40))(pp_Var5,0xfffffff8);
    exit(-1);
  }
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (iVar9 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
    p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    msg_if_given_abi_cxx11_
              ((string *)local_d8,"last_log_idx: %lu, starting_idx: %lu, cur_nxt_idx: %lu\n",
               local_a8,local_a0._M_pi,p_Var20);
    (*p_Var11->_vptr__Sp_counted_base[8])
              (p_Var11,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"create_append_entries_req",0x199,(string *)local_d8);
    if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  context::get_params((context *)local_d8);
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&p_Var12->_vptr__Sp_counted_base + (long)*(int *)(local_d8._0_8_ + 0x24));
  if (p_Var20 <= p_Var11) {
    p_Var11 = p_Var20;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_68._M_unused._M_object = peVar18[0x3a]._vptr_rpc_client_factory;
  local_68._8_8_ = (long)&p_Var12->_vptr__Sp_counted_base + 1;
  uVar21 = p_Var11;
  if ((p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_unused._0_8_) &&
     ((ulong)local_68._8_8_ < p_Var11)) {
    LOCK();
    *(int *)&peVar18[0x3b]._vptr_rpc_client_factory =
         *(int *)&peVar18[0x3b]._vptr_rpc_client_factory + 1;
    UNLOCK();
    uVar15 = *(uint *)&peVar18[0x3b]._vptr_rpc_client_factory;
    p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar9 = (*p_Var4->_vptr__Sp_counted_base[7])(), 4 < iVar9)) {
      p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,"last sent log (%lu) to peer %d is not applied, cnt %d",
                 local_68._M_unused._M_object,(ulong)*(uint *)peVar18->_vptr_rpc_client_factory,
                 (ulong)uVar15);
      (*p_Var4->_vptr__Sp_counted_base[8])
                (p_Var4,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x1ad,local_d8);
      peVar18 = local_98;
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
        peVar18 = local_98;
      }
    }
    if (4 < (int)uVar15) {
      uVar21 = p_Var20;
      if ((ulong)local_68._8_8_ < p_Var20) {
        uVar21 = local_68._8_8_;
      }
      p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar9 = (*p_Var4->_vptr__Sp_counted_base[7])(), 4 < iVar9)) {
        p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_((string *)local_d8,"reduce end_idx %lu -> %lu",p_Var11,uVar21);
        (*p_Var4->_vptr__Sp_counted_base[8])
                  (p_Var4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1b1,local_d8);
        peVar18 = local_98;
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
  }
  else {
    LOCK();
    *(undefined4 *)&peVar18[0x3b]._vptr_rpc_client_factory = 0;
    UNLOCK();
  }
  if (p_Var12 < p_Var20) {
    if (p_Var12 < local_a0._M_pi) {
      _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      peVar3 = pp[0x2e].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)&((peVar3->config_).
                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   learner_)(local_d8,peVar3,p_Var12,uVar21,peVar18[0xf]._vptr_rpc_client_factory);
      _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      pmVar16 = (mutex_type *)local_d8._0_8_;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8._0_8_ = (mutex_type *)0x0;
      if (pmVar16 != (mutex_type *)0x0) goto LAB_0018e3a9;
      p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar9 = (*p_Var11->_vptr__Sp_counted_base[7])(), 2 < iVar9)) {
        p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,"failed to retrieve log entries: %lu - %lu",p_Var12,uVar21);
        (*p_Var11->_vptr__Sp_counted_base[8])
                  (p_Var11,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1bf,local_d8);
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
  }
  else {
    _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar16 = (mutex_type *)0x0;
LAB_0018e3a9:
    if (local_a0._M_pi <= p_Var12) {
      local_b0._M_pi = _Var19._M_pi;
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     term_for_log((raft_server *)pp,local_a8);
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar21;
      if (pmVar16 != (mutex_type *)0x0) {
        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var12->_vptr__Sp_counted_base +
                  ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(pmVar16->super___recursive_mutex_base)._M_mutex + 8))->_M_pi -
                   (long)(pmVar16->super___recursive_mutex_base)._M_mutex.__align >> 4));
      }
      if (((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar21) &&
          (p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,
          p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
         (iVar9 = (*p_Var11->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
        p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        local_a0._M_pi = _Var13._M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,"adjusted end_idx due to batch size hint: %lu -> %lu",uVar21,
                   p_Var20);
        (*p_Var11->_vptr__Sp_counted_base[8])
                  (p_Var11,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x200,local_d8);
        _Var13._M_pi = local_a0._M_pi;
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar9 = (*p_Var11->_vptr__Sp_counted_base[7])(), 4 < iVar9)) {
        if (pmVar16 == (mutex_type *)0x0) {
          lVar17 = 0;
        }
        else {
          lVar17 = (long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(pmVar16->super___recursive_mutex_base)._M_mutex + 8))->_M_pi -
                   (long)(pmVar16->super___recursive_mutex_base)._M_mutex.__align >> 4;
        }
        p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,
                   "append_entries for %d with LastLogIndex=%lu, LastLogTerm=%lu, EntriesLength=%zu, CommitIndex=%lu, Term=%lu, peer_last_sent_idx %lu"
                   ,(ulong)*(uint *)local_98->_vptr_rpc_client_factory,local_a8,_Var13._M_pi,lVar17,
                   local_78,local_80._M_pi,local_68._M_unused._M_object);
        (*p_Var11->_vptr__Sp_counted_base[8])
                  (p_Var11,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x208,local_d8);
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      if (p_Var12 == p_Var20) {
        p_Var20 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar9 = (*p_Var20->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
          p_Var20 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)local_d8,"EMPTY PAYLOAD");
          (*p_Var20->_vptr__Sp_counted_base[8])
                    (p_Var20,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20a,local_d8);
          goto LAB_0018ea93;
        }
      }
      else {
        p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ == p_Var20) {
          if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar9 = (*p_Var11->_vptr__Sp_counted_base[7])(), 4 < iVar9)) {
            p_Var20 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            msg_if_given_abi_cxx11_((string *)local_d8,"idx: %lu",p_Var12);
            (*p_Var20->_vptr__Sp_counted_base[8])
                      (p_Var20,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"create_append_entries_req",0x20c,local_d8);
LAB_0018ea93:
            if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_);
            }
          }
        }
        else if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                (iVar9 = (*p_Var11->_vptr__Sp_counted_base[7])(), 4 < iVar9)) {
          p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_d8,"idx range: %lu-%lu",p_Var12,
                     (undefined1 *)((long)&p_Var20[-1]._M_weak_count + 3));
          (*p_Var11->_vptr__Sp_counted_base[8])
                    (p_Var11,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20e,local_d8);
          goto LAB_0018ea93;
        }
      }
      _Var22._M_pi = local_90._M_pi;
      uVar1 = *(undefined4 *)local_98->_vptr_rpc_client_factory;
      (local_90._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      peVar10 = (element_type *)operator_new(0x60);
      _Var19._M_pi = local_b0._M_pi;
      _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     &(peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      (peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x100000001;
      peVar10->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c40a8;
      uVar2 = *(undefined4 *)
               &pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (peVar10->bg_commit_thread_)._M_id._M_thread = (native_handle_type)local_80._M_pi;
      *(undefined4 *)&(peVar10->bg_append_thread_)._M_id._M_thread = 3;
      *(undefined4 *)((long)&(peVar10->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
      *(undefined4 *)&peVar10->bg_append_ea_ = uVar1;
      (peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_005c40f8;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar10->initialized_ = _Var13._M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar10->id_ = local_a8;
      *(element_type **)&peVar10->target_priority_ = local_78;
      (peVar10->priority_change_timer_).t_created_.__d.__r = 0;
      (peVar10->priority_change_timer_).duration_us_ = 0;
      *(undefined8 *)&(peVar10->priority_change_timer_).first_event_fired_ = 0;
      (((enable_shared_from_this<nuraft::raft_server> *)&(_Var22._M_pi)->_M_use_count)->_M_weak_this
      ).super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
      (_Var22._M_pi)->_vptr__Sp_counted_base = (_func_int **)_Var14._M_pi;
      if (pmVar16 != (mutex_type *)0x0) {
        std::
        vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<nuraft::log_entry>*,std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>>
                  ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                    *)&peVar10->priority_change_timer_,
                   (peVar10->priority_change_timer_).duration_us_,
                   (element_type *)(pmVar16->super___recursive_mutex_base)._M_mutex.__align,
                   ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pmVar16->super___recursive_mutex_base)._M_mutex + 8))->_M_pi);
        _Var14._M_pi = extraout_RDX_01;
      }
      LOCK();
      local_98[0x3a]._vptr_rpc_client_factory = (_func_int **)p_Var12;
      UNLOCK();
      goto LAB_0018eb76;
    }
  }
  get_last_snapshot((raft_server *)local_58);
  if ((((_func_int **)local_58._0_8_ == (_func_int **)0x0) || (local_a0._M_pi <= local_a8)) ||
     (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_58._0_8_ <= local_a8)) {
    local_b0._M_pi = _Var19._M_pi;
    if ((create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer == '\0') &&
       (iVar9 = __cxa_guard_acquire(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::
                                     msg_timer), iVar9 != 0)) {
      create_append_entries_req::msg_timer.t_created_.__d.__r = (duration)0;
      create_append_entries_req::msg_timer.duration_us_ = 5000000;
      create_append_entries_req::msg_timer.first_event_fired_ = true;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex.__align = 0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      timer_helper::reset(&create_append_entries_req::msg_timer);
      __cxa_guard_release(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer);
    }
    bVar8 = timer_helper::timeout_and_reset(&create_append_entries_req::msg_timer);
    _Var19._M_pi = local_90._M_pi;
    p_Var20 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar9 = (*p_Var20->_vptr__Sp_counted_base[7])();
      uVar15 = (uint)!bVar8 * 4 + 2;
      if ((int)uVar15 <= iVar9) {
        p_Var20 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,
                   "neither snapshot nor log exists, peer %d, last log %lu, leader\'s start log %lu"
                   ,(ulong)*(uint *)local_98->_vptr_rpc_client_factory,local_a8,local_a0._M_pi);
        (*p_Var20->_vptr__Sp_counted_base[8])
                  (p_Var20,(ulong)uVar15,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1e2,local_d8);
        _Var19._M_pi = local_90._M_pi;
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
    uVar1 = *(undefined4 *)local_98->_vptr_rpc_client_factory;
    ((raft_server *)_Var19._M_pi)->_vptr_raft_server = (_func_int **)0x0;
    peVar10 = (element_type *)operator_new(0x60);
    (peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar10->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c40a8;
    uVar2 = *(undefined4 *)
             &pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (peVar10->bg_commit_thread_)._M_id._M_thread = (native_handle_type)local_80._M_pi;
    *(undefined4 *)&(peVar10->bg_append_thread_)._M_id._M_thread = 0x1c;
    *(undefined4 *)((long)&(peVar10->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
    *(undefined4 *)&peVar10->bg_append_ea_ = uVar1;
    (peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_005c40f8;
    peVar10->initialized_ = (__atomic_base<bool>)0x0;
    *(undefined3 *)&peVar10->field_0x31 = 0;
    peVar10->leader_ = (__atomic_base<int>)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar10->id_ = local_a8;
    *(element_type **)&peVar10->target_priority_ = local_78;
    (peVar10->priority_change_timer_).t_created_.__d.__r = 0;
    (peVar10->priority_change_timer_).duration_us_ = 0;
    *(undefined8 *)&(peVar10->priority_change_timer_).first_event_fired_ = 0;
    (((raft_server *)_Var19._M_pi)->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this
    .super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
    ((raft_server *)_Var19._M_pi)->_vptr_raft_server =
         (_func_int **)
         &(peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var11->_M_use_count = 1;
    p_Var11->_M_weak_count = 1;
    p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4160;
    p_Var11[1]._vptr__Sp_counted_base = (_func_int **)local_a0._M_pi;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c41b0;
    *(undefined4 *)&p_Var12[1]._vptr__Sp_counted_base = 1;
    p_Var12[1]._M_use_count = 0;
    p_Var12[1]._M_weak_count = 0;
    p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    out_of_log_msg::serialize((out_of_log_msg *)local_d8);
    _Var19._M_pi = local_b0._M_pi;
    uVar7 = local_d8._8_8_;
    uVar21 = local_d8._0_8_;
    local_d8._0_8_ = (mutex_type *)0x0;
    uVar6 = local_d8._0_8_;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12[2]._vptr__Sp_counted_base;
    local_d8._0_4_ = (undefined4)uVar21;
    local_d8._4_4_ = SUB84(uVar21,4);
    p_Var12[1]._M_use_count = local_d8._0_4_;
    p_Var12[1]._M_weak_count = local_d8._4_4_;
    p_Var12[2]._vptr__Sp_counted_base = (_func_int **)uVar7;
    local_d8._0_8_ = uVar6;
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    local_6c = 0;
    custom_notification_msg::serialize((custom_notification_msg *)(local_58 + 0x18));
    local_82 = custom;
    local_d8._0_8_ = (mutex_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(log_entry **)local_d8,
               (allocator<nuraft::log_entry> *)&local_81,&local_6c,
               (shared_ptr<nuraft::buffer> *)(local_58 + 0x18),&local_82);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._32_8_);
    }
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)((local_90._M_pi)->_vptr__Sp_counted_base + 7),(value_type *)local_d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    _Var14._M_pi = extraout_RDX;
    _Var22._M_pi = local_90._M_pi;
  }
  else {
    p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar9 = (*p_Var11->_vptr__Sp_counted_base[7])(), 4 < iVar9)) {
      p_Var11 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,
                 "send snapshot peer %d, peer log idx: %lu, my starting idx: %lu, my log idx: %lu, last_snapshot_log_idx: %lu"
                 ,(ulong)*(uint *)local_98->_vptr_rpc_client_factory,local_a8,local_a0._M_pi,p_Var20
                 ,*(_func_int **)local_58._0_8_);
      (*p_Var11->_vptr__Sp_counted_base[8])
                (p_Var11,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x1d5,local_d8);
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    _Var22._M_pi = local_90._M_pi;
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
    pVar23 = create_sync_snapshot_req
                       ((raft_server *)local_90._M_pi,pp,local_58._16_8_,(ulong)local_a8,
                        (ulong)local_80._M_pi,(bool *)local_78);
    _Var14 = pVar23.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  }
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var14._M_pi = extraout_RDX_00;
  }
LAB_0018eb76:
  if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
    _Var14._M_pi = extraout_RDX_02;
  }
  pVar23.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  pVar23.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var22._M_pi;
  return (ptr<req_msg>)pVar23.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_append_entries_req(ptr<peer>& pp) {
    peer& p = *pp;
    ulong cur_nxt_idx(0L);
    ulong commit_idx(0L);
    ulong last_log_idx(0L);
    ulong term(0L);
    ulong starting_idx(1L);

    {
        recur_lock(lock_);
        starting_idx = log_store_->start_index();
        cur_nxt_idx = precommit_index_ + 1;
        commit_idx = quick_commit_index_;
        term = state_->get_term();
    }

    {
        std::lock_guard<std::mutex> guard(p.get_lock());
        if (p.get_next_log_idx() == 0L) {
            p.set_next_log_idx(cur_nxt_idx);
        }

        last_log_idx = p.get_next_log_idx() - 1;
    }

    if (last_log_idx >= cur_nxt_idx) {
        // LCOV_EXCL_START
        p_er( "Peer's lastLogIndex is too large %" PRIu64 " v.s. %" PRIu64 ", ",
              last_log_idx, cur_nxt_idx );
        ctx_->state_mgr_->system_exit(raft_err::N8_peer_last_log_idx_too_large);
        ::exit(-1);
        return ptr<req_msg>();
        // LCOV_EXCL_STOP
    }

    // cur_nxt_idx: last log index of myself (leader).
    // starting_idx: start log index of myself (leader).
    // last_log_idx: last log index of replica (follower).
    // end_idx: if (cur_nxt_idx - last_log_idx) > max_append_size, limit it.

    p_tr("last_log_idx: %" PRIu64 ", starting_idx: %" PRIu64
         ", cur_nxt_idx: %" PRIu64 "\n",
         last_log_idx, starting_idx, cur_nxt_idx);

    // Verify log index range.
    bool entries_valid = (last_log_idx + 1 >= starting_idx);

    // Read log entries. The underlying log store may have removed some log entries
    // causing some of the requested entries to be unavailable. The log store should
    // return nullptr to indicate such errors.
    ulong end_idx = std::min( cur_nxt_idx,
                              last_log_idx + 1 + ctx_->get_params()->max_append_size_ );

    // NOTE: If this is a retry, probably the follower is down.
    //       Send just one log until it comes back
    //       (i.e., max_append_size_ = 1).
    //       Only when end_idx - start_idx > 1, and 5th try.
    ulong peer_last_sent_idx = p.get_last_sent_idx();
    if ( last_log_idx + 1 == peer_last_sent_idx &&
         last_log_idx + 2 < end_idx ) {
        int32 cur_cnt = p.inc_cnt_not_applied();
        p_db("last sent log (%" PRIu64 ") to peer %d is not applied, cnt %d",
             peer_last_sent_idx, p.get_id(), cur_cnt);
        if (cur_cnt >= 5) {
            ulong prev_end_idx = end_idx;
            end_idx = std::min( cur_nxt_idx, last_log_idx + 1 + 1 );
            p_db("reduce end_idx %" PRIu64 " -> %" PRIu64, prev_end_idx, end_idx);
        }
    } else {
        p.reset_cnt_not_applied();
    }

    ptr<std::vector<ptr<log_entry>>> log_entries;
    if ((last_log_idx + 1) >= cur_nxt_idx) {
        log_entries = ptr<std::vector<ptr<log_entry>>>();
    } else if (entries_valid) {
        log_entries = log_store_->log_entries_ext(last_log_idx + 1, end_idx,
                                                  p.get_next_batch_size_hint_in_bytes());
        if (log_entries == nullptr) {
            p_wn("failed to retrieve log entries: %" PRIu64 " - %" PRIu64,
                 last_log_idx + 1, end_idx);
            entries_valid = false;
        }
    }

    if (!entries_valid) {
        // Required log entries are missing. First, we try to use snapshot to recover.
        // To avoid inconsistency due to smart pointer, should have local varaible
        // to increase its ref count.
        ptr<snapshot> snp_local = get_last_snapshot();

        // Modified by Jung-Sang Ahn (Oct 11 2017):
        // As `reserved_log` has been newly added, need to check snapshot
        // in addition to `starting_idx`.
        if ( snp_local &&
             last_log_idx < starting_idx &&
             last_log_idx < snp_local->get_last_log_idx() ) {
            p_db( "send snapshot peer %d, peer log idx: %" PRIu64
                  ", my starting idx: %" PRIu64 ", "
                  "my log idx: %" PRIu64 ", last_snapshot_log_idx: %" PRIu64,
                  p.get_id(),
                  last_log_idx, starting_idx, cur_nxt_idx,
                  snp_local->get_last_log_idx() );

            bool succeeded_out = false;
            return create_sync_snapshot_req( pp, last_log_idx, term,
                                             commit_idx, succeeded_out );
        }

        // Cannot recover using snapshot. Return here to protect the leader.
        static timer_helper msg_timer(5000000);
        int log_lv = msg_timer.timeout_and_reset() ? L_ERROR : L_TRACE;
        p_lv(log_lv,
             "neither snapshot nor log exists, peer %d, last log %" PRIu64 ", "
             "leader's start log %" PRIu64,
             p.get_id(), last_log_idx, starting_idx);

        // Send out-of-log-range notification to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, msg_type::custom_notification_request,
                             id_, p.get_id(), 0, last_log_idx, commit_idx );

        // Out-of-log message.
        ptr<out_of_log_msg> ool_msg = cs_new<out_of_log_msg>();
        ool_msg->start_idx_of_leader_ = starting_idx;

        // Create a notification containing OOL message.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::out_of_log_range_warning );
        custom_noti->ctx_ = ool_msg->serialize();

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        return req;
    }

    ulong last_log_term = term_for_log(last_log_idx);
    ulong adjusted_end_idx = end_idx;
    if (log_entries) adjusted_end_idx = last_log_idx + 1 + log_entries->size();
    if (adjusted_end_idx != end_idx) {
        p_tr("adjusted end_idx due to batch size hint: %" PRIu64 " -> %" PRIu64,
             end_idx, adjusted_end_idx);
    }

    p_db( "append_entries for %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm=%" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 ", "
          "Term=%" PRIu64 ", peer_last_sent_idx %" PRIu64,
          p.get_id(), last_log_idx, last_log_term,
          ( log_entries ? log_entries->size() : 0 ), commit_idx, term,
          peer_last_sent_idx );
    if (last_log_idx+1 == adjusted_end_idx) {
        p_tr( "EMPTY PAYLOAD" );
    } else if (last_log_idx+1 + 1 == adjusted_end_idx) {
        p_db( "idx: %" PRIu64, last_log_idx+1 );
    } else {
        p_db( "idx range: %" PRIu64 "-%" PRIu64, last_log_idx+1, adjusted_end_idx-1 );
    }

    ptr<req_msg> req
        ( cs_new<req_msg>
          ( term, msg_type::append_entries_request, id_, p.get_id(),
            last_log_term, last_log_idx, commit_idx ) );
    std::vector<ptr<log_entry>>& v = req->log_entries();
    if (log_entries) {
        v.insert(v.end(), log_entries->begin(), log_entries->end());
    }
    p.set_last_sent_idx(last_log_idx + 1);

    return req;
}